

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int archive_read_open1(archive *_a)

{
  size_t *psVar1;
  code *pcVar2;
  undefined8 *puVar3;
  archive_read_filter *paVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  archive_read_filter *paVar8;
  size_t *psVar9;
  uint uVar10;
  archive_read_filter *paVar11;
  char *pcVar12;
  archive_read_filter *self;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  char **ppcVar16;
  long lVar17;
  char **ppcVar18;
  long local_38;
  
  iVar5 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar5 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  if (_a[1].current_code == (char *)0x0) {
    archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
  }
  else {
    pcVar2 = (code *)_a[1].error_string.buffer_length;
    if ((pcVar2 != (code *)0x0) &&
       (iVar5 = (*pcVar2)(_a,*(undefined8 *)(*(long *)&_a[2].compression_code + 0x10)), iVar5 != 0))
    {
      lVar17._0_4_ = _a[2].magic;
      lVar17._4_4_ = _a[2].state;
      if (lVar17 == 0) {
        return iVar5;
      }
      lVar17 = 0x10;
      for (uVar14 = 0; uVar14 < (uint)_a[2].archive_format; uVar14 = uVar14 + 1) {
        (**(code **)(_a + 2))(_a,*(undefined8 *)(*(long *)&_a[2].compression_code + lVar17));
        lVar17 = lVar17 + 0x18;
      }
      return iVar5;
    }
    paVar8 = (archive_read_filter *)calloc(1,0xb0);
    if (paVar8 == (archive_read_filter *)0x0) {
      return -0x1e;
    }
    paVar8->archive = (archive_read *)_a;
    puVar3 = *(undefined8 **)&_a[2].compression_code;
    paVar8->data = (void *)puVar3[2];
    paVar8->open = client_open_proxy;
    paVar8->read = client_read_proxy;
    paVar8->skip = client_skip_proxy;
    paVar8->seek = client_seek_proxy;
    paVar8->close = client_close_proxy;
    paVar8->sswitch = client_switch_proxy;
    paVar8->name = "none";
    *puVar3 = 0;
    self = (archive_read_filter *)_a[8].compression_name;
    if ((self == (archive_read_filter *)0x0) || (paVar4 = self, _a[8].file_count == 0)) {
      _a[8].compression_name = (char *)paVar8;
      iVar5 = 0;
      ppcVar16 = (char **)0x0;
      iVar7 = 0;
      ppcVar18 = &_a[2].compression_name;
      do {
        for (; iVar7 != 0xe; iVar7 = iVar7 + 1) {
          if (((code *)ppcVar18[2] != (code *)0x0) &&
             (iVar6 = (*(code *)ppcVar18[2])(ppcVar18,_a[8].compression_name), iVar5 < iVar6)) {
            ppcVar16 = ppcVar18;
            iVar5 = iVar6;
          }
          ppcVar18 = ppcVar18 + 6;
        }
        if (ppcVar16 == (char **)0x0) {
          __archive_read_filter_ahead((archive_read_filter *)_a[8].compression_name,1,&local_38);
          if (-1 < local_38) {
            self = (archive_read_filter *)_a[8].compression_name;
            _a->compression_name = self->name;
            _a->compression_code = self->code;
            goto LAB_00119293;
          }
          break;
        }
        pcVar12 = (char *)calloc(1,0xb0);
        if (pcVar12 == (char *)0x0) goto LAB_001192bf;
        *(char ***)(pcVar12 + 8) = ppcVar16;
        *(archive **)(pcVar12 + 0x18) = _a;
        *(char **)(pcVar12 + 0x10) = _a[8].compression_name;
        _a[8].compression_name = pcVar12;
        iVar6 = (*(code *)((archive_string *)(ppcVar16 + 3))->s)(pcVar12);
        iVar5 = 0;
        ppcVar16 = (char **)0x0;
        iVar7 = 0;
        ppcVar18 = &_a[2].compression_name;
      } while (iVar6 == 0);
      __archive_read_close_filters((archive_read *)_a);
      __archive_read_free_filters((archive_read *)_a);
LAB_001192bf:
      _a->state = 0x8000;
      return -0x1e;
    }
    do {
      paVar11 = paVar4;
      paVar4 = paVar11->upstream;
    } while (paVar4 != (archive_read_filter *)0x0);
    paVar11->upstream = paVar8;
LAB_00119293:
    if (_a[0x15].archive_format_name != (char *)0x0) {
LAB_0011929d:
      _a->state = 2;
      client_switch_proxy(self,0);
      return 0;
    }
    psVar1 = &_a[8].error_string.length;
    iVar5 = -1;
    uVar15 = 0;
    uVar14 = 0xffffffff;
    psVar9 = psVar1;
    while( true ) {
      _a[0x15].archive_format_name = (char *)psVar9;
      uVar13 = (uint)uVar14;
      if (uVar15 == 0x10) break;
      if ((code *)psVar9[2] != (code *)0x0) {
        iVar7 = (*(code *)psVar9[2])(_a);
        if (iVar7 == -0x1e) goto LAB_001193ab;
        if (*(long *)_a[8].compression_name != 0) {
          __archive_read_seek((archive_read *)_a,0,0);
        }
        uVar10 = uVar15;
        if (-1 < (int)uVar13 && iVar7 <= iVar5) {
          uVar10 = uVar13;
          iVar7 = iVar5;
        }
        psVar9 = (size_t *)_a[0x15].archive_format_name;
        uVar14 = (ulong)uVar10;
        iVar5 = iVar7;
      }
      uVar15 = uVar15 + 1;
      psVar9 = psVar9 + 0xb;
    }
    if ((int)uVar13 < 0) {
      pcVar12 = "No formats registered";
    }
    else {
      if (0 < iVar5) {
        _a[0x15].archive_format_name = (char *)(psVar1 + uVar14 * 0xb);
        self = (archive_read_filter *)_a[8].compression_name;
        goto LAB_0011929d;
      }
      pcVar12 = "Unrecognized archive format";
    }
    archive_set_error(_a,0x54,pcVar12);
LAB_001193ab:
    __archive_read_close_filters((archive_read *)_a);
  }
  _a->state = 0x8000;
  return -0x1e;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			if (a->client.closer) {
				for (i = 0; i < a->client.nodes; i++)
					(a->client.closer)(&a->archive,
					    a->client.dataset[i].data);
			}
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->open = client_open_proxy;
	filter->read = client_read_proxy;
	filter->skip = client_skip_proxy;
	filter->seek = client_seek_proxy;
	filter->close = client_close_proxy;
	filter->sswitch = client_switch_proxy;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			__archive_read_close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}